

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

uint16_t bitset_container_maximum(bitset_container_t *container)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  short sVar5;
  
  uVar4 = 0x400;
  sVar5 = -1;
  while( true ) {
    uVar3 = (int)uVar4 - 1;
    uVar4 = (ulong)uVar3;
    uVar1 = container->words[uVar4];
    lVar2 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    if (uVar1 != 0) break;
    sVar5 = sVar5 + -0x40;
    if (uVar3 < 2) {
      return 0;
    }
  }
  return sVar5 - ((ushort)lVar2 ^ 0x3f);
}

Assistant:

uint16_t bitset_container_maximum(const bitset_container_t *container) {
  for (int32_t i = BITSET_CONTAINER_SIZE_IN_WORDS - 1; i > 0; --i ) {
    uint64_t w = container->words[i];
    if (w != 0) {
      int r = roaring_leading_zeroes(w);
      return i * 64 + 63  - r;
    }
  }
  return 0;
}